

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall absl::strings_internal::BigUnsigned<84>::SetToZero(BigUnsigned<84> *this)

{
  undefined4 *in_RDI;
  uint *unaff_retaddr;
  int in_stack_0000000c;
  
  std::fill_n<unsigned_int*,int,unsigned_int>((uint *)this,in_stack_0000000c,unaff_retaddr);
  *in_RDI = 0;
  return;
}

Assistant:

void SetToZero() {
    std::fill_n(words_, size_, 0u);
    size_ = 0;
  }